

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MercatorTile.cpp
# Opt level: O2

vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *
mercatortile::children
          (vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_> *__return_storage_ptr__,
          Tile *tile)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Tile local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = tile->x;
  uVar3 = tile->y;
  local_20.y = uVar3 * 2;
  local_20.x = uVar1 * 2;
  local_20.z = tile->z + 1;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
  emplace_back<mercatortile::Tile>(__return_storage_ptr__,&local_20);
  local_20.y = tile->y * 2;
  local_20.x = tile->x * 2 + 1;
  local_20.z = tile->z + 1;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
  emplace_back<mercatortile::Tile>(__return_storage_ptr__,&local_20);
  local_20.y = tile->y * 2 + 1;
  local_20.x = tile->x * 2;
  local_20.z = tile->z + 1;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
  emplace_back<mercatortile::Tile>(__return_storage_ptr__,&local_20);
  uVar2 = tile->x;
  uVar4 = tile->y;
  local_20._0_8_ = CONCAT44(uVar4 * 2,uVar2 * 2) | (ulong)DAT_00107090;
  local_20.z = tile->z + 1;
  std::vector<mercatortile::Tile,_std::allocator<mercatortile::Tile>_>::
  emplace_back<mercatortile::Tile>(__return_storage_ptr__,&local_20);
  return __return_storage_ptr__;
}

Assistant:

vector<Tile> children(const Tile &tile)
{
    vector<Tile> return_tiles;
    return_tiles.push_back(Tile{tile.x * 2, tile.y * 2, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2 + 1, tile.y * 2, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2, tile.y * 2 + 1, tile.z + 1});
    return_tiles.push_back(Tile{tile.x * 2 + 1, tile.y * 2 + 1, tile.z + 1});

    return return_tiles;
}